

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void __thiscall Edge::Dump(Edge *this,char *prefix)

{
  Pool *pPVar1;
  pointer ppNVar2;
  
  printf("%s[ ");
  for (ppNVar2 = (this->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (ppNVar2 !=
       (this->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish && (*ppNVar2 != (Node *)0x0)); ppNVar2 = ppNVar2 + 1) {
    printf("%s ",((*ppNVar2)->path_)._M_dataplus._M_p);
  }
  printf("--%s-> ",(this->rule_->name_)._M_dataplus._M_p);
  for (ppNVar2 = (this->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (ppNVar2 !=
       (this->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish && (*ppNVar2 != (Node *)0x0)); ppNVar2 = ppNVar2 + 1) {
    printf("%s ",((*ppNVar2)->path_)._M_dataplus._M_p);
  }
  if ((this->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    printf(" validations ");
    for (ppNVar2 = (this->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        (ppNVar2 !=
         (this->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish && (*ppNVar2 != (Node *)0x0)); ppNVar2 = ppNVar2 + 1) {
      printf("%s ",((*ppNVar2)->path_)._M_dataplus._M_p);
    }
  }
  pPVar1 = this->pool_;
  if (pPVar1 == (Pool *)0x0) {
    printf("(null pool?)");
  }
  else if ((pPVar1->name_)._M_string_length != 0) {
    printf("(in pool \'%s\')",(pPVar1->name_)._M_dataplus._M_p);
  }
  printf("] 0x%p\n",this);
  return;
}

Assistant:

void Edge::Dump(const char* prefix) const {
  printf("%s[ ", prefix);
  for (vector<Node*>::const_iterator i = inputs_.begin();
       i != inputs_.end() && *i != NULL; ++i) {
    printf("%s ", (*i)->path().c_str());
  }
  printf("--%s-> ", rule_->name().c_str());
  for (vector<Node*>::const_iterator i = outputs_.begin();
       i != outputs_.end() && *i != NULL; ++i) {
    printf("%s ", (*i)->path().c_str());
  }
  if (!validations_.empty()) {
    printf(" validations ");
    for (std::vector<Node*>::const_iterator i = validations_.begin();
         i != validations_.end() && *i != NULL; ++i) {
      printf("%s ", (*i)->path().c_str());
    }
  }
  if (pool_) {
    if (!pool_->name().empty()) {
      printf("(in pool '%s')", pool_->name().c_str());
    }
  } else {
    printf("(null pool?)");
  }
  printf("] 0x%p\n", this);
}